

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cpp
# Opt level: O3

void __thiscall RPCClient::_DoRead(RPCClient *this,Handle handle,BufferPtr *data,uint32_t len)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
  *this_00;
  bool bVar1;
  int len_00;
  const_iterator cVar2;
  _Any_data *p_Var3;
  undefined8 uVar4;
  int code;
  int type;
  string name;
  uint32_t need_len;
  vector<cppnet::Any,_std::allocator<cppnet::Any>_> vec;
  char recv_buf [8192];
  int local_20a4;
  _Base_ptr local_20a0;
  int local_2098;
  uint local_2094;
  key_type local_2090;
  undefined4 local_206c;
  vector<cppnet::Any,_std::allocator<cppnet::Any>_> local_2068;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2048;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2040;
  char local_2038 [2];
  char local_2036 [8198];
  
  local_2040 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               handle.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  memset(local_2038,0,0x2000);
  local_206c = 0;
  this_00 = &this->_func_call_map;
  local_20a0 = &(this->_func_call_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2048 = &this->_func_map;
  do {
    len_00 = (**(code **)(*local_2040->_vptr__Sp_counted_base + 0x38))
                       (local_2040->_vptr__Sp_counted_base,local_2038,0x2000,"\r\n\r\n",4,
                        &local_206c);
    if (len_00 == 0) {
      return;
    }
    local_2068.super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2068.super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2068.super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2094 = 0;
    local_2090._M_dataplus._M_p = (pointer)&local_2090.field_2;
    local_2090._M_string_length = 0;
    local_2090.field_2._M_local_buf[0] = '\0';
    local_2098 = 0;
    bVar1 = ParsePackage::ParseType
                      ((this->_parse_package).
                       super___shared_ptr<ParsePackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_2038,len_00,(int *)&local_2094);
    if (bVar1) {
      if ((local_2094 & 2) == 0) {
        bVar1 = true;
        if ((local_2094 & 4) != 0) {
          bVar1 = ParsePackage::ParseFuncList
                            ((this->_parse_package).
                             super___shared_ptr<ParsePackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             local_2036,len_00 + -2,local_2048);
          if (bVar1) {
            cVar2 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                    ::find(&this_00->_M_t,&local_2090);
            if (cVar2._M_node != local_20a0) {
              p_Var3 = (_Any_data *)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                       ::operator[](this_00,&local_2090);
              local_20a4 = 1;
              if (*(long *)(p_Var3 + 1) == 0) goto LAB_0010f356;
              (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3,&local_20a4,&local_2068);
            }
          }
          else {
            cVar2 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                    ::find(&this_00->_M_t,&local_2090);
            if (cVar2._M_node != local_20a0) {
              p_Var3 = (_Any_data *)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                       ::operator[](this_00,&local_2090);
              local_20a4 = 4;
              if (*(long *)(p_Var3 + 1) == 0) goto LAB_0010f356;
              (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3,&local_20a4,&local_2068);
            }
          }
          goto LAB_0010f202;
        }
      }
      else {
        bVar1 = ParsePackage::ParseFuncRet
                          ((this->_parse_package).
                           super___shared_ptr<ParsePackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           local_2036,len_00 + -2,&local_2098,&local_2090,local_2048,&local_2068);
        if (!bVar1) {
          cVar2 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                  ::find(&this_00->_M_t,&local_2090);
          if (cVar2._M_node != local_20a0) {
            p_Var3 = (_Any_data *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                     ::operator[](this_00,&local_2090);
            local_20a4 = 4;
            if (*(long *)(p_Var3 + 1) == 0) goto LAB_0010f356;
            (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3,&local_20a4,&local_2068);
          }
          goto LAB_0010f202;
        }
        cVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                ::find(&this_00->_M_t,&local_2090);
        bVar1 = true;
        if (cVar2._M_node != local_20a0) {
          p_Var3 = (_Any_data *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                   ::operator[](this_00,&local_2090);
          local_20a4 = local_2098;
          if (*(long *)(p_Var3 + 1) == 0) {
LAB_0010f356:
            uVar4 = std::__throw_bad_function_call();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2090._M_dataplus._M_p != &local_2090.field_2) {
              operator_delete(local_2090._M_dataplus._M_p);
            }
            std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>::~vector(&local_2068);
            _Unwind_Resume(uVar4);
          }
          (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3,&local_20a4,&local_2068);
        }
      }
    }
    else {
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
              ::find(&this_00->_M_t,&local_2090);
      if (cVar2._M_node != local_20a0) {
        p_Var3 = (_Any_data *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                 ::operator[](this_00,&local_2090);
        local_20a4 = 1;
        if (*(long *)(p_Var3 + 1) == 0) goto LAB_0010f356;
        (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3,&local_20a4,&local_2068);
      }
LAB_0010f202:
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2090._M_dataplus._M_p != &local_2090.field_2) {
      operator_delete(local_2090._M_dataplus._M_p);
    }
    std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>::~vector(&local_2068);
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void RPCClient::_DoRead(cppnet::Handle handle, cppnet::BufferPtr data,
                         uint32_t len) {
    char recv_buf[8192] = { 0 };
    uint32_t get_len = 8192;
    uint32_t need_len = 0;
    uint32_t recv_len = 0;
    for (;;) {
        get_len = data->ReadUntil(recv_buf, 8192, "\r\n\r\n", strlen("\r\n\r\n"), need_len);
        if (get_len == 0) {
            break;
        }
        std::vector<cppnet::Any> vec;
        int type = 0;
        std::string name;
        int code = NO_ERROR;
        if (!_parse_package->ParseType(recv_buf, get_len, type)) {
            if (_func_call_map.count(name)) {
                _func_call_map[name](PARAM_TYPE_ERROR, vec);
            }
            break;
        }
        if (type & FUNCTION_RET) {
            if (!_parse_package->ParseFuncRet(recv_buf + 2, get_len - 2, code, name, _func_map, vec)) {
                if (_func_call_map.count(name)) {
                    _func_call_map[name](PARSE_FUNC_ERROR, vec);
                }
                break;
            }
            if (_func_call_map.count(name)) {
                _func_call_map[name](code, vec);
            }

        } else if (type & FUNCTION_INFO) {
            if (!_parse_package->ParseFuncList(recv_buf + 2, get_len - 2, _func_map)) {
                if (_func_call_map.count(name)) {
                    _func_call_map[name](PARSE_FUNC_ERROR, vec);
                }
                break;

            } else {
                if (_func_call_map.count(name)) {
                    _func_call_map[name](PARAM_TYPE_ERROR, vec);
                }
                break;
            }
        }
    }
}